

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O1

GLFWbool pollJoystickEvents(_GLFWjoystickLinux *js)

{
  GLFWbool GVar1;
  int *piVar2;
  ssize_t sVar3;
  js_event e;
  undefined1 local_30 [4];
  short local_2c;
  byte local_2a;
  byte local_29;
  
  _glfwPollJoystickEvents();
  if (js->present == 0) {
    GVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    do {
      *piVar2 = 0;
      sVar3 = read(js->fd,local_30,8);
      if (sVar3 < 0) {
        if (*piVar2 == 0x13) {
          free(js->axes);
          free(js->buttons);
          free(js->name);
          free(js->path);
          *(undefined8 *)&js->buttonCount = 0;
          js->name = (char *)0x0;
          *(undefined8 *)&js->axisCount = 0;
          js->buttons = (uchar *)0x0;
          js->present = 0;
          js->fd = 0;
          js->axes = (float *)0x0;
          js->path = (char *)0x0;
          _glfwInputJoystickChange((int)((ulong)(js + -0x56a7) >> 3) * -0x49249249,0x40002);
        }
      }
      else {
        local_2a = local_2a & 0x7f;
        if (local_2a == 1) {
          js->buttons[local_29] = local_2c != 0;
        }
        else if (local_2a == 2) {
          js->axes[local_29] = (float)(int)local_2c / 32767.0;
        }
      }
    } while (-1 < sVar3);
    GVar1 = js->present;
  }
  return GVar1;
}

Assistant:

static GLFWbool pollJoystickEvents(_GLFWjoystickLinux* js)
{
#if defined(__linux__)
    _glfwPollJoystickEvents();

    if (!js->present)
        return GLFW_FALSE;

    // Read all queued events (non-blocking)
    for (;;)
    {
        struct js_event e;

        errno = 0;
        if (read(js->fd, &e, sizeof(e)) < 0)
        {
            // Reset the joystick slot if the device was disconnected
            if (errno == ENODEV)
            {
                free(js->axes);
                free(js->buttons);
                free(js->name);
                free(js->path);

                memset(js, 0, sizeof(_GLFWjoystickLinux));

                _glfwInputJoystickChange(js - _glfw.linux_js.js,
                                         GLFW_DISCONNECTED);
            }

            break;
        }

        // Clear the initial-state bit
        e.type &= ~JS_EVENT_INIT;

        if (e.type == JS_EVENT_AXIS)
            js->axes[e.number] = (float) e.value / 32767.0f;
        else if (e.type == JS_EVENT_BUTTON)
            js->buttons[e.number] = e.value ? GLFW_PRESS : GLFW_RELEASE;
    }
#endif // __linux__
    return js->present;
}